

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineDepthTests.cpp
# Opt level: O0

TestStatus *
vkt::pipeline::anon_unknown_0::testSupportsDepthStencilFormat
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format)

{
  bool bVar1;
  InstanceInterface *instanceInterface;
  VkPhysicalDevice device;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  VkFormat local_1c;
  Context *pCStack_18;
  VkFormat format_local;
  Context *context_local;
  
  local_1c = format;
  pCStack_18 = context;
  context_local = (Context *)__return_storage_ptr__;
  instanceInterface = Context::getInstanceInterface(context);
  device = Context::getPhysicalDevice(pCStack_18);
  bVar1 = isSupportedDepthStencilFormat(instanceInterface,device,local_1c);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Format can be used in depth/stencil attachment",&local_41);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Unsupported depth/stencil attachment format",&local_79);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testSupportsDepthStencilFormat (Context& context, VkFormat format)
{
	DE_ASSERT(vk::isDepthStencilFormat(format));

	if (isSupportedDepthStencilFormat(context.getInstanceInterface(), context.getPhysicalDevice(), format))
		return tcu::TestStatus::pass("Format can be used in depth/stencil attachment");
	else
		return tcu::TestStatus::fail("Unsupported depth/stencil attachment format");
}